

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O2

int tnt_request_writeout(tnt_stream *s,tnt_request *req,uint64_t *sync)

{
  undefined1 *puVar1;
  tnt_request_t tVar2;
  tnt_iterator_t tVar3;
  int iVar4;
  uint64_t uVar5;
  char *pcVar6;
  bool bVar7;
  undefined1 uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  ssize_t sVar12;
  uint uVar13;
  ulong uVar14;
  uint32_t size;
  char *pcVar15;
  int iVar16;
  char header [128];
  iovec v [10];
  
  tVar2 = (req->hdr).type;
  if (((sync != (uint64_t *)0x0) && (*sync == 0x7fffffffffffffff)) &&
     ((~s->reqid & 0x7fffffffffffffff) == 0)) {
    s->reqid = 0;
  }
  uVar5 = s->reqid;
  s->reqid = uVar5 + 1;
  (req->hdr).sync = uVar5;
  pcVar6 = header + 1;
  v[0].iov_base = (void *)0x0;
  header[1] = -0x7e;
  header[2] = '\0';
  header._120_8_ = pcVar6;
  pcVar9 = mp_encode_uint(header + 3,(ulong)tVar2);
  *pcVar9 = '\x01';
  pcVar9 = mp_encode_uint(pcVar9 + 1,(req->hdr).sync);
  pcVar10 = pcVar9 + 1;
  size = 0;
  if ((tVar2 < TNT_OP_CALL) && ((0x23fU >> (tVar2 & 0x1f) & 1) != 0)) {
    size = 1;
    pcVar9[1] = '\x10';
    pcVar10 = mp_encode_uint(pcVar9 + 2,(ulong)req->space_id);
  }
  uVar13 = req->index_id;
  if ((((ulong)uVar13 != 0) && (tVar2 < TNT_OP_CALL_16)) && ((0x32U >> (tVar2 & 0x1f) & 1) != 0)) {
    *pcVar10 = '\x11';
    pcVar10 = mp_encode_uint(pcVar10 + 1,(ulong)uVar13);
    size = size + 1;
  }
  if (tVar2 == TNT_OP_SELECT) {
    *pcVar10 = '\x12';
    pcVar10 = mp_encode_uint(pcVar10 + 1,(ulong)req->limit);
    uVar13 = req->offset;
    if ((ulong)uVar13 == 0) {
      size = size + 1;
    }
    else {
      *pcVar10 = '\x13';
      pcVar10 = mp_encode_uint(pcVar10 + 1,(ulong)uVar13);
      size = size + 2;
    }
    tVar3 = req->iterator;
    if ((ulong)tVar3 != 0) {
      *pcVar10 = '\x14';
      pcVar10 = mp_encode_uint(pcVar10 + 1,(ulong)tVar3);
      size = size + 1;
    }
  }
  pcVar15 = req->key;
  v[9].iov_len = (size_t)sync;
  if (pcVar15 == (char *)0x0) {
    iVar16 = 1;
    pcVar15 = pcVar6;
    goto LAB_00107149;
  }
  iVar16 = -1;
  switch(tVar2) {
  case TNT_OP_SELECT:
  case TNT_OP_UPDATE:
  case TNT_OP_DELETE:
    *pcVar10 = ' ';
    break;
  default:
    goto switchD_001070e5_caseD_2;
  case TNT_OP_CALL_16:
  case TNT_OP_CALL:
    *pcVar10 = '\"';
    goto LAB_001070fa;
  case TNT_OP_EVAL:
    *pcVar10 = '\'';
LAB_001070fa:
    pcVar10 = mp_encode_strl(pcVar10 + 1,*(int *)&req->key_end - (int)pcVar15);
    goto LAB_00107113;
  case TNT_OP_UPSERT:
    *pcVar10 = '(';
  }
  pcVar10 = pcVar10 + 1;
LAB_00107113:
  v[1].iov_base = pcVar10 + -(long)pcVar6;
  v[1].iov_len = (size_t)req->key;
  v[2].iov_base = req->key_end + -v[1].iov_len;
  size = size + 1;
  iVar16 = 3;
  pcVar15 = pcVar10;
  v[0].iov_len = (size_t)pcVar6;
LAB_00107149:
  pcVar6 = req->tuple;
  if (pcVar6 != (char *)0x0) {
    *pcVar10 = '!';
    pcVar10 = pcVar10 + 1;
    uVar14 = (ulong)(uint)(iVar16 << 4);
    *(char **)(header + uVar14 + 0x78) = pcVar15;
    *(long *)((long)&v[0].iov_base + uVar14) = (long)pcVar10 - (long)pcVar15;
    *(char **)((long)&v[0].iov_len + uVar14) = pcVar6;
    iVar16 = iVar16 + 2;
    *(long *)((long)&v[1].iov_base + uVar14) = (long)req->tuple_end - (long)pcVar6;
    size = size + 1;
    pcVar15 = pcVar10;
  }
  iVar4 = req->index_base;
  if (((long)iVar4 != 0) && (((ulong)tVar2 == 9 || (tVar2 == TNT_OP_UPDATE)))) {
    *pcVar10 = '\x15';
    pcVar10 = mp_encode_uint(pcVar10 + 1,(long)iVar4);
    size = size + 1;
  }
  if ((long)pcVar10 - (long)pcVar15 != 0) {
    uVar13 = iVar16 << 4;
    *(char **)(header + (ulong)uVar13 + 0x78) = pcVar15;
    iVar16 = iVar16 + 1;
    *(long *)((long)&v[0].iov_base + (ulong)uVar13) = (long)pcVar10 - (long)pcVar15;
  }
  mp_encode_map(pcVar9,size);
  uVar11 = 0;
  for (uVar14 = 0x10; (uint)(iVar16 << 4) != uVar14; uVar14 = uVar14 + 0x10) {
    uVar11 = uVar11 + *(long *)((long)&v[0].iov_base + uVar14);
  }
  bVar7 = uVar11 >> 0x20 == 0;
  puVar1 = (undefined1 *)(header._120_8_ + -9 + (ulong)bVar7 * 4);
  if (bVar7) {
    uVar13 = (uint)uVar11;
    *(uint *)(puVar1 + 1) =
         uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    uVar8 = 0xce;
  }
  else {
    *(ulong *)(puVar1 + 1) =
         uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18 |
         (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
         (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
    uVar8 = 0xcf;
  }
  *puVar1 = uVar8;
  header._120_8_ = puVar1;
  v[0].iov_base = (void *)((long)v[0].iov_base + (ulong)!bVar7 * 4 + 5);
  sVar12 = (*s->writev)(s,(iovec *)(header + 0x78),iVar16);
  iVar16 = -(uint)(sVar12 == -1);
  if ((v[9].iov_len != 0) && (sVar12 != -1)) {
    *(uint64_t *)v[9].iov_len = (req->hdr).sync;
    iVar16 = 0;
  }
switchD_001070e5_caseD_2:
  return iVar16;
}

Assistant:

int
tnt_request_writeout(struct tnt_stream *s, struct tnt_request *req,
		     uint64_t *sync) {
	enum tnt_request_t tp = req->hdr.type;
	if (sync != NULL && *sync == INT64_MAX &&
	    (s->reqid & INT64_MAX) == INT64_MAX) {
		s->reqid = 0;
	}
	req->hdr.sync = s->reqid++;
	/* header */
	/* int (9) + 1 + sync + 1 + op */
	struct iovec v[10]; int v_sz = 0;
	char header[128];
	char *pos = header + 9;
	char *begin = pos;
	v[v_sz].iov_base = begin;
	v[v_sz++].iov_len  = 0;
	pos = mp_encode_map(pos, 2);              /* 1 */
	pos = mp_encode_uint(pos, TNT_CODE);      /* 1 */
	pos = mp_encode_uint(pos, req->hdr.type); /* 1 */
	pos = mp_encode_uint(pos, TNT_SYNC);      /* 1 */
	pos = mp_encode_uint(pos, req->hdr.sync); /* 9 */
	char *map = pos++;                        /* 1 */
	size_t nd = 0;
	if (tp < TNT_OP_CALL_16 || tp == TNT_OP_UPSERT) {
		pos = mp_encode_uint(pos, TNT_SPACE);     /* 1 */
		pos = mp_encode_uint(pos, req->space_id); /* 5 */
		nd += 1;
	}
	if (req->index_id && (tp == TNT_OP_SELECT ||
			      tp == TNT_OP_UPDATE ||
			      tp == TNT_OP_DELETE)) {
		pos = mp_encode_uint(pos, TNT_INDEX);     /* 1 */
		pos = mp_encode_uint(pos, req->index_id); /* 5 */
		nd += 1;
	}
	if (tp == TNT_OP_SELECT) {
		pos = mp_encode_uint(pos, TNT_LIMIT);  /* 1 */
		pos = mp_encode_uint(pos, req->limit); /* 5 */
		nd += 1;
	}
	if (req->offset && tp == TNT_OP_SELECT) {
		pos = mp_encode_uint(pos, TNT_OFFSET);  /* 1 */
		pos = mp_encode_uint(pos, req->offset); /* 5 */
		nd += 1;
	}
	if (req->iterator && tp == TNT_OP_SELECT) {
		pos = mp_encode_uint(pos, TNT_ITERATOR);  /* 1 */
		pos = mp_encode_uint(pos, req->iterator); /* 1 */
		nd += 1;
	}
	if (req->key) {
		switch (tp) {
		case TNT_OP_EVAL:
			pos = mp_encode_uint(pos, TNT_EXPRESSION);          /* 1 */
			pos = mp_encode_strl(pos, req->key_end - req->key); /* 5 */
			break;
		case TNT_OP_CALL_16:
		case TNT_OP_CALL:
			pos = mp_encode_uint(pos, TNT_FUNCTION);            /* 1 */
			pos = mp_encode_strl(pos, req->key_end - req->key); /* 5 */
			break;
		case TNT_OP_SELECT:
		case TNT_OP_UPDATE:
		case TNT_OP_DELETE:
			pos = mp_encode_uint(pos, TNT_KEY); /* 1 */
			break;
		case TNT_OP_UPSERT:
			pos = mp_encode_uint(pos, TNT_OPS); /* 1 */
			break;
		default:
			return -1;
		}
		v[v_sz].iov_base  = begin;
		v[v_sz++].iov_len = pos - begin;
		begin = pos;
		v[v_sz].iov_base  = (void *)req->key;
		v[v_sz++].iov_len = req->key_end - req->key;
		nd += 1;
	}
	if (req->tuple) {
		pos = mp_encode_uint(pos, TNT_TUPLE); /* 1 */
		v[v_sz].iov_base  = begin;
		v[v_sz++].iov_len = pos - begin;
		begin = pos;
		v[v_sz].iov_base  = (void *)req->tuple;
		v[v_sz++].iov_len = req->tuple_end - req->tuple;
		nd += 1;
	}
	if (req->index_base && (tp == TNT_OP_UPDATE || tp == TNT_OP_UPSERT)) {
		pos = mp_encode_uint(pos, TNT_INDEX_BASE);  /* 1 */
		pos = mp_encode_uint(pos, req->index_base); /* 1 */
		nd += 1;
	}
	assert(mp_sizeof_map(nd) == 1);
	if (pos != begin) {
		v[v_sz].iov_base  = begin;
		v[v_sz++].iov_len = pos - begin;
	}
	mp_encode_map(map, nd);

	size_t plen = 0;
	for (int i = 1; i < v_sz; ++i) plen += v[i].iov_len;
	size_t hlen = mp_sizeof_luint32(plen);
	v[0].iov_base -= hlen;
	v[0].iov_len  += hlen;
	mp_encode_luint32(v[0].iov_base, plen);
	ssize_t rv = s->writev(s, v, v_sz);
	if (rv == -1)
		return -1;
	if (sync != NULL)
		*sync = req->hdr.sync;
	return 0;
}